

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Display.cpp
# Opt level: O2

bool __thiscall
MT32Emu::Display::customDisplayMessageReceived
          (Display *this,Bit8u *message,Bit32u startIndex,Bit32u length)

{
  uint uVar1;
  bool bVar2;
  ulong uVar3;
  Bit8u BVar4;
  
  bVar2 = Synth::isDisplayOldMT32Compatible(this->synth);
  if (bVar2) {
    for (uVar3 = 0; uVar3 != 0x14; uVar3 = uVar3 + 1) {
      BVar4 = ' ';
      if (uVar3 < length) {
        BVar4 = message[uVar3];
      }
      if ((char)BVar4 < '!') {
        BVar4 = ' ';
      }
      this->customMessageBuffer[uVar3] = BVar4;
    }
    if ((this->synth->controlROMFeatures->field_0x1 & 1) == 0) {
      if (this->mode == Mode_PROGRAM_CHANGE) {
        return false;
      }
      if (this->mode == Mode_ERROR_MESSAGE) {
        return false;
      }
    }
  }
  else {
    if (0x80 < startIndex) {
      return false;
    }
    if (startIndex == 0x80) {
      if (this->mode == Mode_PROGRAM_CHANGE) {
        return false;
      }
      this->displayResetScheduled = false;
      this->mode = Mode_MAIN;
      bVar2 = false;
      goto LAB_001636a2;
    }
    this->displayResetScheduled = false;
    if (startIndex < 0x14) {
      uVar1 = 0x14 - startIndex;
      if (length <= 0x14 - startIndex) {
        uVar1 = length;
      }
      memcpy(this->customMessageBuffer + startIndex,message,(ulong)uVar1);
    }
  }
  this->mode = Mode_CUSTOM_MESSAGE;
  bVar2 = true;
LAB_001636a2:
  this->lcdDirty = true;
  return bVar2;
}

Assistant:

bool Display::customDisplayMessageReceived(const Bit8u *message, Bit32u startIndex, Bit32u length) {
	if (synth.isDisplayOldMT32Compatible()) {
		for (Bit32u i = 0; i < LCD_TEXT_SIZE; i++) {
			Bit8u c = i < length ? message[i] : ' ';
			if (c < 32 || 127 < c) c = ' ';
			customMessageBuffer[i] = c;
		}
		if (!synth.controlROMFeatures->quirkDisplayCustomMessagePriority
			&& (mode == Mode_PROGRAM_CHANGE || mode == Mode_ERROR_MESSAGE)) return false;
		// Note, real devices keep the display reset timer running.
	} else {
		if (startIndex > 0x80) return false;
		if (startIndex == 0x80) {
			if (mode != Mode_PROGRAM_CHANGE) setMainDisplayMode();
			return false;
		}
		displayResetScheduled = false;
		if (startIndex < LCD_TEXT_SIZE) {
			if (length > LCD_TEXT_SIZE - startIndex) length = LCD_TEXT_SIZE - startIndex;
			memcpy(customMessageBuffer + startIndex, message, length);
		}
	}
	mode = Mode_CUSTOM_MESSAGE;
	lcdDirty = true;
	return true;
}